

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ithiutil.cpp
# Opt level: O0

bool ithi_endswith(char *target,char *suffix)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  size_t ix;
  bool ret;
  size_t suffix_length;
  size_t target_length;
  char *suffix_local;
  char *target_local;
  
  sVar2 = strlen(target);
  sVar3 = strlen(suffix);
  ix._7_1_ = sVar3 <= sVar2;
  if (ix._7_1_) {
    iVar1 = strcmp(target + (sVar2 - sVar3),suffix);
    ix._7_1_ = ix._7_1_ && iVar1 == 0;
  }
  return ix._7_1_;
}

Assistant:

bool ithi_endswith(char const* target, char const* suffix)
{
    size_t target_length = strlen(target);
    size_t suffix_length = strlen(suffix);
    bool ret = suffix_length <= target_length;
    if (ret) {
        size_t ix = target_length - suffix_length;
        ret &= (strcmp(target + ix, suffix) == 0);
    }
    return ret;
}